

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::verifyFloat<unsigned_int>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  bool bVar1;
  uint negated_data;
  uint positive_data;
  uint negated_sign_bit;
  uint positive_sign_bit;
  uint negated_element;
  uint positive_element;
  GLuint i;
  uint *negated_elements;
  uint *positive_elements;
  GLint negated_value_local;
  GLint positive_value_local;
  GLint original_value_local;
  
  if (original_value == positive_value) {
    bVar1 = false;
    while (!bVar1) {
      if ((positive_elements._4_4_ & 0x7fffffff) != ((uint)positive_elements & 0x7fffffff)) {
        return false;
      }
      if ((positive_elements._4_4_ & 0x80000000) == ((uint)positive_elements & 0x80000000)) {
        return false;
      }
      bVar1 = true;
    }
    positive_value_local._3_1_ = true;
  }
  else {
    positive_value_local._3_1_ = false;
  }
  return positive_value_local._3_1_;
}

Assistant:

static bool verifyFloat(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		static const GLuint n_elements		  = sizeof(GLint) / sizeof(T); /* 1, 2, 4 */
		static const GLuint sign_bit_index	= sizeof(T) * 8 - 1;		   /* 7, 15, 31 */
		static const T		sign_bit_mask	 = 1 << sign_bit_index;	   /* 0x80.. */
		static const T		sign_bit_inv_mask = (T)~sign_bit_mask;		   /* 0x7f.. */

		const T* positive_elements = (T*)&positive_value;
		const T* negated_elements  = (T*)&negated_value;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			const T positive_element = positive_elements[i];
			const T negated_element  = negated_elements[i];

			const T positive_sign_bit = positive_element & sign_bit_mask;
			const T negated_sign_bit  = negated_element & sign_bit_mask;

			const T positive_data = positive_element & sign_bit_inv_mask;
			const T negated_data  = negated_element & sign_bit_inv_mask;

			/* Compare data bits */
			if (positive_data != negated_data)
			{
				return false;
			}

			/* Verify that sign bit is inverted */
			if (positive_sign_bit == negated_sign_bit)
			{
				return false;
			}
		}

		return true;
	}